

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

bool __thiscall QGraphicsItem::isUnderMouse(QGraphicsItem *this)

{
  bool bVar1;
  QGraphicsItemPrivate *pQVar2;
  QGraphicsView **ppQVar3;
  ulong uVar4;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QGraphicsView *view;
  QList<QGraphicsView_*> *__range1;
  QGraphicsItemPrivate *d;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QGraphicsView_*> views;
  QPoint cursorPos;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  QGraphicsScene *in_stack_ffffffffffffff58;
  QPointF *point;
  QGraphicsItem *this_00;
  bool local_69;
  QPointF local_50;
  QGraphicsView **local_40;
  const_iterator local_38;
  const_iterator local_30;
  QGraphicsItem local_28;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QGraphicsItem *)0x984500);
  if (pQVar2->scene == (QGraphicsScene *)0x0) {
    local_69 = false;
  }
  else {
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = (undefined1 *)QCursor::pos();
    local_28._vptr_QGraphicsItem = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    local_28.d_ptr.d = (QGraphicsItemPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsScene::views(in_stack_ffffffffffffff58);
    this_00 = &local_28;
    local_30.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
    local_30 = QList<QGraphicsView_*>::begin
                         ((QList<QGraphicsView_*> *)
                          CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    local_38.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
    local_38 = QList<QGraphicsView_*>::end
                         ((QList<QGraphicsView_*> *)
                          CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    while( true ) {
      local_40 = local_38.i;
      bVar1 = QList<QGraphicsView_*>::const_iterator::operator!=(&local_30,local_38);
      if (!bVar1) break;
      ppQVar3 = QList<QGraphicsView_*>::const_iterator::operator*(&local_30);
      point = (QPointF *)*ppQVar3;
      QWidget::mapFromGlobal(in_RDI,(QPoint *)point);
      QGraphicsView::mapToScene((QGraphicsView *)this_00,(QPoint *)point);
      local_50 = mapFromScene(this_00,point);
      uVar4 = (**(code **)(*(long *)in_RDI + 0x28))(in_RDI,&local_50);
      if ((uVar4 & 1) != 0) {
        local_69 = true;
        goto LAB_009846b8;
      }
      QList<QGraphicsView_*>::const_iterator::operator++(&local_30);
    }
    local_69 = false;
LAB_009846b8:
    QList<QGraphicsView_*>::~QList((QList<QGraphicsView_*> *)0x9846c5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_69;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsItem::isUnderMouse() const
{
    Q_D(const QGraphicsItem);
    if (!d->scene)
        return false;

    QPoint cursorPos = QCursor::pos();
    const auto views = d->scene->views();
    for (QGraphicsView *view : views) {
        if (contains(mapFromScene(view->mapToScene(view->mapFromGlobal(cursorPos)))))
            return true;
    }
    return false;
}